

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactive_socket_service_base.hpp
# Opt level: O1

void __thiscall
asio::detail::reactive_socket_service_base::
start_connect_op<asio::detail::reactive_socket_connect_op<std::function<void(std::error_code_const&)>,asio::any_io_executor>>
          (reactive_socket_service_base *this,base_implementation_type *impl,
          reactive_socket_connect_op<std::function<void_(const_std::error_code_&)>,_asio::any_io_executor>
          *op,bool is_continuation,void *addr,size_t addrlen,void *param_6,
          enable_if_t<is_same<typename_associated_immediate_executor<typename_reactive_socket_connect_op<function<void_(const_error_code_&)>,_any_io_executor>::handler_type,_typename_reactive_socket_connect_op<function<void_(const_error_code_&)>,_any_io_executor>::io_executor_type>::asio_associated_immediate_executor_is_unspecialised,_void>::value>
          *param_7)

{
  error_code *this_00;
  long *plVar1;
  reactor *prVar2;
  per_descriptor_data pdVar3;
  reactor *prVar4;
  per_descriptor_data pdVar5;
  reactor_op *prVar6;
  bool bVar7;
  int iVar8;
  error_category *peVar9;
  reactor_op *prVar10;
  error_code local_50;
  error_code local_40;
  
  prVar2 = this->reactor_;
  if (((impl->state_ & 3) == 0) &&
     (bVar7 = socket_ops::set_internal_non_blocking
                        (impl->socket_,&impl->state_,true,
                         &(op->super_reactive_socket_connect_op_base).super_reactor_op.ec_), !bVar7)
     ) {
LAB_0041ea7d:
    scheduler::post_immediate_completion
              (*(scheduler **)&prVar2->mutex_,(operation *)op,is_continuation);
    return;
  }
  this_00 = &(op->super_reactive_socket_connect_op_base).super_reactor_op.ec_;
  iVar8 = socket_ops::connect((socket_ops *)(ulong)(uint)impl->socket_,(int)addr,(sockaddr *)addrlen
                              ,(socklen_t)this_00);
  if ((iVar8 == 0) ||
     (((std::error_code::error_code<asio::error::basic_errors,void>(&local_50,in_progress),
       (op->super_reactive_socket_connect_op_base).super_reactor_op.ec_._M_cat !=
       (error_category *)CONCAT44(local_50._M_cat._4_4_,local_50._M_cat._0_4_) ||
       ((op->super_reactive_socket_connect_op_base).super_reactor_op.ec_._M_value !=
        local_50._M_value)) &&
      ((std::error_code::error_code<asio::error::basic_errors,void>(&local_40,try_again),
       (op->super_reactive_socket_connect_op_base).super_reactor_op.ec_._M_cat != local_40._M_cat ||
       ((op->super_reactive_socket_connect_op_base).super_reactor_op.ec_._M_value !=
        local_40._M_value)))))) goto LAB_0041ea7d;
  peVar9 = (error_category *)std::_V2::system_category();
  (op->super_reactive_socket_connect_op_base).super_reactor_op.ec_._M_value = 0;
  (op->super_reactive_socket_connect_op_base).super_reactor_op.ec_._M_cat = peVar9;
  pdVar3 = impl->reactor_data_;
  if (pdVar3 == (per_descriptor_data)0x0) {
    std::error_code::operator=(this_00,bad_descriptor);
    goto LAB_0041ea7d;
  }
  prVar4 = this->reactor_;
  iVar8 = impl->socket_;
  bVar7 = (pdVar3->mutex_).enabled_;
  if (bVar7 == true) {
    pthread_mutex_lock((pthread_mutex_t *)&(pdVar3->mutex_).mutex_);
  }
  pdVar5 = impl->reactor_data_;
  if (pdVar5->shutdown_ == true) {
LAB_0041ea55:
    scheduler::post_immediate_completion
              (*(scheduler **)&prVar2->mutex_,(operation *)op,is_continuation);
  }
  else {
    if (pdVar5->op_queue_[1].front_ == (reactor_op *)0x0) {
      if (pdVar5->registered_events_ == 0) {
        std::error_code::operator=(this_00,operation_not_supported);
        goto LAB_0041ea55;
      }
      local_50._M_value = pdVar5->registered_events_ | 4;
      pdVar5->registered_events_ = local_50._M_value;
      local_50._4_4_ = SUB84(pdVar5,0);
      local_50._M_cat._0_4_ = (undefined4)((ulong)pdVar5 >> 0x20);
      epoll_ctl(*(int *)&(prVar4->timer_queues_).first_,3,iVar8,(epoll_event *)&local_50);
    }
    pdVar5 = impl->reactor_data_;
    (op->super_reactive_socket_connect_op_base).super_reactor_op.super_operation.next_ =
         (scheduler_operation *)0x0;
    prVar6 = pdVar5->op_queue_[1].back_;
    prVar10 = (reactor_op *)&pdVar5->op_queue_[1].back_;
    if (prVar6 != (reactor_op *)0x0) {
      prVar10 = prVar6;
    }
    (prVar10->super_operation).next_ = (scheduler_operation *)op;
    (&pdVar5->op_queue_[1].front_)[prVar6 != (reactor_op *)0x0] = (reactor_op *)op;
    LOCK();
    plVar1 = (long *)(*(long *)&prVar4->mutex_ + 0xd8);
    *plVar1 = *plVar1 + 1;
    UNLOCK();
  }
  if (bVar7 == false) {
    return;
  }
  pthread_mutex_unlock((pthread_mutex_t *)&(pdVar3->mutex_).mutex_);
  return;
}

Assistant:

void start_connect_op(base_implementation_type& impl, Op* op,
      bool is_continuation, const void* addr, size_t addrlen, const void*,
      enable_if_t<
        is_same<
          typename associated_immediate_executor<
            typename Op::handler_type,
            typename Op::io_executor_type
          >::asio_associated_immediate_executor_is_unspecialised,
          void
        >::value
      >*)
  {
    return do_start_connect_op(impl, op, is_continuation, addr,
        addrlen, &reactor::call_post_immediate_completion, &reactor_);
  }